

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restoration.c
# Opt level: O2

int av1_selfguided_restoration_c
              (uint8_t *dgd8,int width,int height,int dgd_stride,int32_t *flt0,int32_t *flt1,
              int flt_stride,int sgr_params_idx,int bit_depth,int highbd)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  uint8_t *puVar6;
  int32_t *piVar7;
  int32_t *piVar8;
  int dgd_stride_00;
  int32_t *piVar9;
  undefined1 *puVar10;
  int32_t *piVar11;
  long lVar12;
  undefined1 *puVar13;
  undefined1 *puVar14;
  long lVar15;
  int iVar16;
  long lVar17;
  int32_t *piVar18;
  int j;
  long lVar19;
  int32_t aiStack_17be8 [4];
  undefined1 auStack_17bd8 [32384];
  int32_t A_ [8100];
  int32_t dgd32_ [8100];
  
  dgd_stride_00 = width + 6;
  lVar15 = (long)(dgd_stride_00 * 3);
  lVar12 = (long)dgd_stride_00;
  lVar3 = (long)dgd_stride;
  if (highbd == 0) {
    piVar9 = dgd32_ + lVar12 * -3 + lVar15;
    puVar6 = dgd8 + lVar3 * -3;
    for (lVar5 = -3; lVar17 = -3, lVar5 < height + 3; lVar5 = lVar5 + 1) {
      for (; lVar17 < width + 3; lVar17 = lVar17 + 1) {
        piVar9[lVar17 + 3] = (uint)puVar6[lVar17];
      }
      piVar9 = piVar9 + lVar12;
      puVar6 = puVar6 + lVar3;
    }
  }
  else {
    piVar9 = dgd32_ + lVar12 * -3 + lVar15;
    lVar5 = lVar3 * -6 + (long)dgd8 * 2;
    for (lVar17 = -3; lVar19 = -3, lVar17 < height + 3; lVar17 = lVar17 + 1) {
      for (; lVar19 < width + 3; lVar19 = lVar19 + 1) {
        piVar9[lVar19 + 3] = (uint)*(ushort *)(lVar5 + lVar19 * 2);
      }
      piVar9 = piVar9 + lVar12;
      lVar5 = lVar5 + lVar3 * 2;
    }
  }
  piVar9 = dgd32_ + lVar15 + 3;
  if (0 < av1_sgr_params[sgr_params_idx].r[0]) {
    iVar16 = (width + 9U & 0xfffffffc) + 0x10;
    calculate_intermediate_result
              (piVar9,width,height,dgd_stride_00,bit_depth,sgr_params_idx,0,1,A_,aiStack_17be8);
    uVar4 = 0;
    if (0 < width) {
      uVar4 = (ulong)(uint)width;
    }
    uVar1 = 0;
    if (0 < height) {
      uVar1 = (ulong)(uint)height;
    }
    lVar3 = (long)iVar16;
    lVar5 = (long)(iVar16 * 3);
    puVar10 = auStack_17bd8 + lVar5 * 4;
    lVar15 = lVar3 * 4;
    piVar11 = A_ + lVar5 + 4;
    puVar13 = auStack_17bd8 + lVar15 + lVar5 * 4;
    piVar18 = A_ + lVar5 + lVar3 + 4;
    puVar14 = auStack_17bd8 + lVar5 * 4 + lVar3 * -4;
    piVar7 = A_ + ((lVar5 + 4) - lVar3);
    piVar8 = piVar9;
    for (uVar2 = 0; uVar2 != uVar1; uVar2 = uVar2 + 1) {
      lVar5 = 0;
      if ((uVar2 & 1) == 0) {
        for (; uVar4 * 4 != lVar5; lVar5 = lVar5 + 4) {
          *(int *)((long)flt0 + lVar5) =
               ((*(int *)((long)piVar18 + lVar5 + -8) + *(int *)((long)piVar7 + lVar5 + -8) +
                 *(int *)((long)piVar7 + lVar5) + *(int *)((long)piVar18 + lVar5)) * 5 +
               (*(int *)((long)piVar18 + lVar5 + -4) + *(int *)((long)piVar7 + lVar5 + -4)) * 6) *
               *(int *)((long)piVar8 + lVar5) +
               (*(int *)(puVar13 + lVar5 + -8) + *(int *)(puVar14 + lVar5 + -8) +
                *(int *)(puVar14 + lVar5) + *(int *)(puVar13 + lVar5)) * 5 +
               (*(int *)(puVar13 + lVar5 + -4) + *(int *)(puVar14 + lVar5 + -4)) * 6 + 0x100 >> 9;
        }
      }
      else {
        for (; uVar4 * 4 != lVar5; lVar5 = lVar5 + 4) {
          *(int *)((long)flt0 + lVar5) =
               (*(int *)(puVar10 + lVar5) + *(int *)(puVar10 + lVar5 + -8)) * 5 +
               *(int *)(puVar10 + lVar5 + -4) * 6 +
               ((*(int *)((long)piVar11 + lVar5) + *(int *)((long)piVar11 + lVar5 + -8)) * 5 +
               *(int *)((long)piVar11 + lVar5 + -4) * 6) * *(int *)((long)piVar8 + lVar5) + 0x80 >>
               8;
        }
      }
      flt0 = flt0 + flt_stride;
      piVar8 = piVar8 + lVar12;
      puVar10 = puVar10 + lVar15;
      piVar11 = piVar11 + lVar3;
      puVar13 = puVar13 + lVar15;
      piVar18 = piVar18 + lVar3;
      puVar14 = puVar14 + lVar15;
      piVar7 = piVar7 + lVar3;
    }
  }
  if (0 < av1_sgr_params[sgr_params_idx].r[1]) {
    iVar16 = (width + 9U & 0xfffffffc) + 0x10;
    calculate_intermediate_result
              (piVar9,width,height,dgd_stride_00,bit_depth,sgr_params_idx,1,0,A_,aiStack_17be8);
    lVar3 = (long)iVar16;
    uVar1 = 0;
    uVar4 = (ulong)(uint)width;
    if (width < 1) {
      uVar4 = uVar1;
    }
    uVar2 = (ulong)(uint)height;
    if (height < 1) {
      uVar2 = uVar1;
    }
    lVar5 = (long)(iVar16 * 3);
    puVar10 = auStack_17bd8 + lVar5 * 4;
    lVar15 = lVar3 * 4;
    puVar13 = auStack_17bd8 + lVar15 + lVar5 * 4;
    piVar8 = A_ + lVar5 + lVar3 + 4;
    puVar14 = auStack_17bd8 + lVar5 * 4 + lVar3 * -4;
    piVar7 = A_ + ((lVar5 + 4) - lVar3);
    piVar11 = A_ + lVar5 + 4;
    for (; uVar1 != uVar2; uVar1 = uVar1 + 1) {
      for (lVar5 = 0; uVar4 << 2 != lVar5; lVar5 = lVar5 + 4) {
        *(int *)((long)flt1 + lVar5) =
             ((*(int *)((long)piVar8 + lVar5 + -8) + *(int *)((long)piVar7 + lVar5 + -8) +
               *(int *)((long)piVar7 + lVar5) + *(int *)((long)piVar8 + lVar5)) * 3 +
             (*(int *)((long)piVar11 + lVar5 + -8) + *(int *)((long)piVar11 + lVar5 + -4) +
              *(int *)((long)piVar11 + lVar5) + *(int *)((long)piVar7 + lVar5 + -4) +
             *(int *)((long)piVar8 + lVar5 + -4)) * 4) * *(int *)((long)piVar9 + lVar5) +
             (*(int *)(puVar13 + lVar5 + -8) + *(int *)(puVar14 + lVar5 + -8) +
              *(int *)(puVar14 + lVar5) + *(int *)(puVar13 + lVar5)) * 3 +
             (*(int *)(puVar10 + lVar5 + -8) + *(int *)(puVar10 + lVar5 + -4) +
              *(int *)(puVar10 + lVar5) + *(int *)(puVar14 + lVar5 + -4) +
             *(int *)(puVar13 + lVar5 + -4)) * 4 + 0x100 >> 9;
      }
      flt1 = flt1 + flt_stride;
      piVar9 = piVar9 + lVar12;
      puVar10 = puVar10 + lVar15;
      puVar13 = puVar13 + lVar15;
      piVar8 = piVar8 + lVar3;
      puVar14 = puVar14 + lVar15;
      piVar7 = piVar7 + lVar3;
      piVar11 = piVar11 + lVar3;
    }
  }
  return 0;
}

Assistant:

int av1_selfguided_restoration_c(const uint8_t *dgd8, int width, int height,
                                 int dgd_stride, int32_t *flt0, int32_t *flt1,
                                 int flt_stride, int sgr_params_idx,
                                 int bit_depth, int highbd) {
  int32_t dgd32_[RESTORATION_PROC_UNIT_PELS];
  const int dgd32_stride = width + 2 * SGRPROJ_BORDER_HORZ;
  int32_t *dgd32 =
      dgd32_ + dgd32_stride * SGRPROJ_BORDER_VERT + SGRPROJ_BORDER_HORZ;

  if (highbd) {
    const uint16_t *dgd16 = CONVERT_TO_SHORTPTR(dgd8);
    for (int i = -SGRPROJ_BORDER_VERT; i < height + SGRPROJ_BORDER_VERT; ++i) {
      for (int j = -SGRPROJ_BORDER_HORZ; j < width + SGRPROJ_BORDER_HORZ; ++j) {
        dgd32[i * dgd32_stride + j] = dgd16[i * dgd_stride + j];
      }
    }
  } else {
    for (int i = -SGRPROJ_BORDER_VERT; i < height + SGRPROJ_BORDER_VERT; ++i) {
      for (int j = -SGRPROJ_BORDER_HORZ; j < width + SGRPROJ_BORDER_HORZ; ++j) {
        dgd32[i * dgd32_stride + j] = dgd8[i * dgd_stride + j];
      }
    }
  }

  const sgr_params_type *const params = &av1_sgr_params[sgr_params_idx];
  // If params->r == 0 we skip the corresponding filter. We only allow one of
  // the radii to be 0, as having both equal to 0 would be equivalent to
  // skipping SGR entirely.
  assert(!(params->r[0] == 0 && params->r[1] == 0));

  if (params->r[0] > 0)
    selfguided_restoration_fast_internal(dgd32, width, height, dgd32_stride,
                                         flt0, flt_stride, bit_depth,
                                         sgr_params_idx, 0);
  if (params->r[1] > 0)
    selfguided_restoration_internal(dgd32, width, height, dgd32_stride, flt1,
                                    flt_stride, bit_depth, sgr_params_idx, 1);
  return 0;
}